

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layer_Dxx_top(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int cols;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  bool *pbVar6;
  float *pfVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int rows;
  uint uVar11;
  uint uVar12;
  int cols_00;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int col;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  int local_198;
  int local_178;
  float *local_168;
  bool *local_140;
  int local_e0;
  int local_d8;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  
  pfVar5 = layer->response;
  iVar30 = iimage->data_width;
  iVar1 = layer->step;
  lVar33 = (long)iVar1;
  cols = layer->filter_size;
  pbVar6 = layer->laplacian;
  iVar2 = layer->width;
  iVar3 = layer->height;
  cols_00 = cols / 3;
  uVar11 = (cols + -1) / 2;
  pfVar7 = iimage->data;
  fVar38 = 1.0 / (float)(cols * cols);
  iVar4 = iimage->width;
  uVar12 = cols / 6;
  iVar32 = uVar12 + iVar1;
  iVar22 = -(iVar32 % iVar1);
  iVar34 = iVar30 * (cols_00 + -1);
  iVar18 = iVar1 * iVar30;
  uVar13 = ~uVar12;
  iVar28 = uVar13 + cols_00;
  iVar23 = iVar32 + iVar34;
  local_e0 = uVar13 + iVar23;
  local_d8 = iVar28 + iVar23;
  iVar23 = iVar23 + uVar11;
  iVar14 = -cols_00;
  rows = cols_00 * 2 + -1;
  iVar15 = iVar28 + iVar34;
  iVar16 = uVar11 + iVar34;
  for (iVar29 = 0; iVar17 = iVar29 - cols_00, iVar29 < cols_00; iVar29 = iVar29 + iVar1) {
    iVar19 = iVar29 + 1;
    lVar20 = (long)((iVar29 / iVar1) * iVar2);
    local_168 = pfVar5 + lVar20;
    local_140 = pbVar6 + lVar20;
    iVar26 = 1;
    for (lVar24 = 0; lVar21 = (long)(iVar32 - iVar32 % iVar1), iVar36 = local_e0, iVar25 = local_d8,
        iVar27 = iVar32 - cols_00, iVar37 = iVar32 + 1, iVar35 = iVar23, lVar24 <= (int)uVar12;
        lVar24 = lVar24 + lVar33) {
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)pfVar7[iVar15 + -1 + iVar26]),
                                SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)pfVar7[iVar16 + -1 + iVar26]));
      fVar39 = box_integral(iimage,iVar29 - uVar11,iVar14 + iVar26,cols,rows);
      auVar44._0_4_ = box_integral(iimage,iVar29 - uVar12,iVar14 + iVar26,cols_00,rows);
      auVar44._4_60_ = extraout_var;
      auVar9 = vfmadd132ss_fma(auVar44._0_16_,ZEXT416((uint)fVar39),ZEXT416(0xc0400000));
      fVar40 = box_integral(iimage,iVar17,iVar26,cols_00,cols_00);
      iVar36 = iVar14 + -1 + iVar26;
      fVar41 = box_integral(iimage,iVar19,iVar36,cols_00,cols_00);
      fVar42 = box_integral(iimage,iVar17,iVar36,cols_00,cols_00);
      fVar43 = box_integral(iimage,iVar19,iVar26,cols_00,cols_00);
      fVar39 = fVar38 * auVar9._0_4_;
      fVar8 = fVar38 * auVar10._0_4_;
      fVar40 = fVar38 * (((fVar41 + fVar40) - fVar42) - fVar43);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40 * -0.81)),ZEXT416((uint)fVar8),
                               ZEXT416((uint)fVar39));
      pfVar5[lVar20] = auVar9._0_4_;
      iVar26 = iVar1 + iVar26;
      pbVar6[lVar20] = 0.0 <= fVar8 + fVar39;
      local_168 = local_168 + 1;
      local_140 = local_140 + 1;
      lVar20 = lVar20 + 1;
    }
    for (; lVar21 <= (int)uVar11; lVar21 = lVar21 + lVar33) {
      iVar26 = iVar22 + 1 + iVar27;
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)(pfVar7[iVar22 + iVar25] - pfVar7[iVar22 + iVar36])),
                                SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)pfVar7[iVar22 + iVar35]));
      fVar39 = box_integral(iimage,iVar29 - uVar11,iVar26,cols,rows);
      auVar45._0_4_ = box_integral(iimage,iVar29 - uVar12,iVar26,cols_00,rows);
      auVar45._4_60_ = extraout_var_00;
      auVar9 = vfmadd132ss_fma(auVar45._0_16_,ZEXT416((uint)fVar39),ZEXT416(0xc0400000));
      fVar40 = box_integral(iimage,iVar17,iVar22 + iVar37,cols_00,cols_00);
      fVar41 = box_integral(iimage,iVar19,iVar22 + iVar27,cols_00,cols_00);
      fVar42 = box_integral(iimage,iVar17,iVar22 + iVar27,cols_00,cols_00);
      fVar43 = box_integral(iimage,iVar19,iVar22 + iVar37,cols_00,cols_00);
      fVar39 = fVar38 * auVar9._0_4_;
      fVar8 = fVar38 * auVar10._0_4_;
      fVar40 = fVar38 * (((fVar41 + fVar40) - fVar42) - fVar43);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40 * -0.81)),ZEXT416((uint)fVar8),
                               ZEXT416((uint)fVar39));
      *local_168 = auVar9._0_4_;
      *local_140 = 0.0 <= fVar8 + fVar39;
      local_168 = local_168 + 1;
      local_140 = local_140 + 1;
      iVar36 = iVar36 + iVar1;
      iVar25 = iVar25 + iVar1;
      iVar27 = iVar27 + iVar1;
      iVar37 = iVar37 + iVar1;
      iVar35 = iVar35 + iVar1;
    }
    iVar15 = iVar15 + iVar18;
    local_d8 = local_d8 + iVar18;
    local_e0 = local_e0 + iVar18;
    iVar16 = iVar16 + iVar18;
    iVar23 = iVar23 + iVar18;
  }
  iVar16 = (int)(uVar11 + iVar1) / iVar1;
  iVar29 = iVar16 * iVar1;
  iVar15 = iVar2 * iVar1;
  iVar18 = iVar1 * iVar30;
  local_178 = iVar29 + -1 + iVar34;
  iVar28 = iVar28 + iVar29 + iVar34;
  iVar23 = iVar29 + iVar34 + uVar11;
  local_198 = local_178 - uVar12;
  local_178 = local_178 - uVar11;
  for (iVar22 = 0; iVar22 < cols_00; iVar22 = iVar22 + iVar1) {
    iVar32 = 0;
    lVar24 = (long)((iVar22 / iVar1) * iVar2 + iVar16);
    for (lVar20 = (long)iVar29; lVar20 < (int)(iVar15 - uVar11); lVar20 = lVar20 + lVar33) {
      iVar17 = (iVar29 - cols_00) + 1 + iVar32;
      iVar19 = (iVar29 - cols_00) + iVar32;
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)(pfVar7[iVar28 + iVar32] - pfVar7[local_198 + iVar32])
                                       ),SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(pfVar7[iVar23 + iVar32] - pfVar7[local_178 + iVar32])
                                       ));
      fVar39 = box_integral(iimage,iVar22 - uVar11,iVar17,cols,rows);
      auVar46._0_4_ = box_integral(iimage,iVar22 - uVar12,iVar17,cols_00,rows);
      auVar46._4_60_ = extraout_var_01;
      auVar9 = vfmadd132ss_fma(auVar46._0_16_,ZEXT416((uint)fVar39),ZEXT416(0xc0400000));
      iVar17 = iVar29 + 1 + iVar32;
      fVar40 = box_integral(iimage,iVar22 - cols_00,iVar17,cols_00,cols_00);
      fVar41 = box_integral(iimage,iVar22 + 1,iVar19,cols_00,cols_00);
      fVar42 = box_integral(iimage,iVar22 - cols_00,iVar19,cols_00,cols_00);
      fVar43 = box_integral(iimage,iVar22 + 1,iVar17,cols_00,cols_00);
      fVar39 = fVar38 * auVar9._0_4_;
      fVar8 = fVar38 * auVar10._0_4_;
      fVar40 = fVar38 * (((fVar41 + fVar40) - fVar42) - fVar43);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40 * -0.81)),ZEXT416((uint)fVar8),
                               ZEXT416((uint)fVar39));
      pfVar5[lVar24] = auVar9._0_4_;
      iVar32 = iVar1 + iVar32;
      pbVar6[lVar24] = 0.0 <= fVar8 + fVar39;
      lVar24 = lVar24 + 1;
    }
    iVar28 = iVar28 + iVar18;
    local_198 = local_198 + iVar18;
    iVar23 = iVar23 + iVar18;
    local_178 = local_178 + iVar18;
  }
  iVar22 = (int)(~uVar11 + iVar1 + iVar15) / iVar1;
  iVar26 = (iVar15 - uVar12) + iVar1;
  iVar23 = iVar26 + -1;
  iVar19 = iVar22 * iVar1;
  iVar17 = iVar23 % iVar1;
  iVar16 = iVar34 - uVar12;
  iVar29 = iVar1 * iVar30;
  iVar18 = uVar13 + iVar34 + cols_00 + iVar19;
  iVar28 = iVar19 + -1 + iVar34;
  iVar32 = iVar28 - uVar12;
  iVar28 = iVar28 - uVar11;
  iVar34 = iVar34 - uVar11;
  uVar31 = 0;
  while( true ) {
    iVar36 = (int)uVar31;
    iVar25 = iVar36 - cols_00;
    if ((long)cols_00 <= (long)uVar31) break;
    iVar37 = 0;
    iVar27 = iVar36 + 1;
    lVar24 = (long)((cols_00 + -1 + iVar36) * iVar30) + (long)iVar4;
    local_168 = (float *)(long)((int)((long)((ulong)(uint)(iVar36 >> 0x1f) << 0x20 |
                                            uVar31 & 0xffffffff) / (long)iVar1) * iVar2 + iVar22);
    for (lVar20 = (long)iVar19; lVar21 = (long)(iVar23 - iVar17), iVar35 = iVar26 - iVar17,
        lVar20 < (int)(iVar15 - uVar12); lVar20 = lVar20 + lVar33) {
      iVar35 = (iVar19 - cols_00) + 1 + iVar37;
      col = (iVar19 - cols_00) + iVar37;
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)(pfVar7[iVar18 + iVar37] - pfVar7[iVar32 + iVar37])),
                                SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(pfVar7[lVar24 + -1] - pfVar7[iVar28 + iVar37])));
      fVar39 = box_integral(iimage,iVar36 - uVar11,iVar35,cols,rows);
      auVar47._0_4_ = box_integral(iimage,iVar36 - uVar12,iVar35,cols_00,rows);
      auVar47._4_60_ = extraout_var_02;
      auVar9 = vfmadd132ss_fma(auVar47._0_16_,ZEXT416((uint)fVar39),ZEXT416(0xc0400000));
      iVar35 = iVar19 + 1 + iVar37;
      fVar40 = box_integral(iimage,iVar25,iVar35,cols_00,cols_00);
      fVar41 = box_integral(iimage,iVar27,col,cols_00,cols_00);
      fVar42 = box_integral(iimage,iVar25,col,cols_00,cols_00);
      fVar43 = box_integral(iimage,iVar27,iVar35,cols_00,cols_00);
      fVar39 = fVar38 * auVar9._0_4_;
      fVar8 = fVar38 * auVar10._0_4_;
      fVar40 = fVar38 * (((fVar41 + fVar40) - fVar42) - fVar43);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40 * -0.81)),ZEXT416((uint)fVar8),
                               ZEXT416((uint)fVar39));
      pfVar5[(long)local_168] = auVar9._0_4_;
      pbVar6[(long)local_168] = 0.0 <= fVar8 + fVar39;
      local_168 = (float *)((long)local_168 + 1);
      iVar37 = iVar37 + iVar1;
    }
    for (; lVar21 < iVar15; lVar21 = lVar21 + lVar33) {
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)(pfVar7[lVar24 + -1] - pfVar7[iVar16 + -2 + iVar35])),
                                SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(pfVar7[lVar24 + -1] - pfVar7[iVar34 + -2 + iVar35])))
      ;
      fVar39 = box_integral(iimage,iVar36 - uVar11,iVar14 + iVar35,cols,rows);
      auVar48._0_4_ = box_integral(iimage,iVar36 - uVar12,iVar14 + iVar35,cols_00,rows);
      auVar48._4_60_ = extraout_var_03;
      auVar9 = vfmadd132ss_fma(auVar48._0_16_,ZEXT416((uint)fVar39),ZEXT416(0xc0400000));
      fVar40 = box_integral(iimage,iVar25,iVar35,cols_00,cols_00);
      iVar37 = iVar14 + -1 + iVar35;
      fVar41 = box_integral(iimage,iVar27,iVar37,cols_00,cols_00);
      fVar42 = box_integral(iimage,iVar25,iVar37,cols_00,cols_00);
      fVar43 = box_integral(iimage,iVar27,iVar35,cols_00,cols_00);
      fVar39 = fVar38 * auVar9._0_4_;
      fVar8 = fVar38 * auVar10._0_4_;
      fVar40 = fVar38 * (((fVar41 + fVar40) - fVar42) - fVar43);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40 * -0.81)),ZEXT416((uint)fVar8),
                               ZEXT416((uint)fVar39));
      pfVar5[(long)local_168] = auVar9._0_4_;
      pbVar6[(long)local_168] = 0.0 <= fVar8 + fVar39;
      local_168 = (float *)((long)local_168 + 1);
      iVar35 = iVar35 + iVar1;
    }
    uVar31 = uVar31 + lVar33;
    iVar18 = iVar18 + iVar29;
    iVar32 = iVar32 + iVar29;
    iVar28 = iVar28 + iVar29;
    iVar16 = iVar16 + iVar29;
    iVar34 = iVar34 + iVar29;
  }
  iVar30 = cols_00 + iVar1 + -1;
  for (iVar30 = iVar30 - iVar30 % iVar1; iVar30 < iVar3 * iVar1; iVar30 = iVar30 + iVar1) {
    iVar28 = iVar30 - cols_00;
    lVar33 = (long)((iVar30 / iVar1) * iVar2);
    iVar16 = -uVar11;
    iVar23 = iVar14;
    iVar4 = -uVar12;
    for (iVar34 = 1; iVar34 + -1 < iVar15; iVar34 = iVar34 + iVar1) {
      fVar39 = box_integral(iimage,iVar28 + 1,iVar16,rows,cols);
      auVar49._0_4_ = box_integral(iimage,iVar28 + 1,iVar4,rows,cols_00);
      auVar49._4_60_ = extraout_var_04;
      auVar10 = vfmadd213ss_fma(auVar49._0_16_,SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar39))
      ;
      fVar39 = box_integral(iimage,iVar30 - uVar11,iVar23 + 1,cols,rows);
      auVar50._0_4_ = box_integral(iimage,iVar30 - uVar12,iVar23 + 1,cols_00,rows);
      auVar50._4_60_ = extraout_var_05;
      auVar9 = vfmadd132ss_fma(auVar50._0_16_,ZEXT416((uint)fVar39),ZEXT416(0xc0400000));
      fVar40 = box_integral(iimage,iVar28,iVar34,cols_00,cols_00);
      fVar41 = box_integral(iimage,iVar30 + 1,iVar23,cols_00,cols_00);
      fVar42 = box_integral(iimage,iVar28,iVar23,cols_00,cols_00);
      fVar43 = box_integral(iimage,iVar30 + 1,iVar34,cols_00,cols_00);
      fVar39 = fVar38 * auVar9._0_4_;
      fVar8 = fVar38 * auVar10._0_4_;
      fVar40 = fVar38 * (((fVar41 + fVar40) - fVar42) - fVar43);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40 * -0.81)),ZEXT416((uint)fVar8),
                               ZEXT416((uint)fVar39));
      pfVar5[lVar33] = auVar9._0_4_;
      pbVar6[lVar33] = 0.0 <= fVar8 + fVar39;
      lVar33 = lVar33 + 1;
      iVar4 = iVar4 + iVar1;
      iVar16 = iVar16 + iVar1;
      iVar23 = iVar23 + iVar1;
    }
  }
  return;
}

Assistant:

void compute_response_layer_Dxx_top(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_Dxx_leftcorner

        optimization:
        - Dxx box filter hand optimized and split into cases (here only top)
    */
    float Dxx, Dyy, Dxy;
    int x, y;
    int r0, r1, c0, c1, r00, r01, c00, c01, r10, r11, c10, c11;
    float Dxx0, Dxx1;
    float A, B, C, D;
    int k, k0;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size * filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float *) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    /*
        In our optimized function, i and j are raw coordinates in the integral
        / original image. In the original function these coordinates are
        coordinates of the layer. We changed it this way in the optimized function
        because its easier to about corner cases in raw coordinates.
    */

    k = (lobe / 2 + 1 + step - 1) / step * step;

    // Top Left Corner
    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width;

        // Case 1: C of neg part outside
        for (int j = 0; j < lobe / 2 + 1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + lobe - 1;
            c01 = y + border;

            Dxx0 = data[r01 * data_width + c01];

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            D = data[r11 * data_width + c11];
            Dxx1 = D;

            Dxx = Dxx0 - 3 * Dxx1;

            // Compute Dxx, Dxy
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }

        // Case 2: B of neg part inside
        // initial value has to be rounded up to next bigger step
        for (int j = k; j < border + 1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c01 = y + border;

            Dxx0 = data[r01 * data_width + c01];

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Compute Dxx, Dxy
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid
    k = (border + 1 + step - 1) / step * step;

    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width + (k / step);

        for (int j = k; j < width * step - border; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;
            c01 = y + border;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) -
                  box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right
    k = (width * step - border + step - 1) / step * step;
    k0 = (width * step - lobe / 2 + step - 1) / step * step;

    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width + (k / step);

        // Case 1: D of neg part inside
        for (int j = k; j < width * step - lobe / 2; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }

        // Case 2: D of neg part outside
        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (lobe + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}